

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::link_program(NegativeTestContext *ctx)

{
  undefined *puVar1;
  NegativeTestContext *pNVar2;
  deUint32 dVar3;
  RenderContext *renderCtx;
  char *local_2a0;
  char *tfVarying;
  GLuint local_290;
  deUint32 tfID;
  deUint32 buf;
  allocator<char> local_261;
  string local_260;
  ProgramSources local_240;
  undefined1 local_170 [8];
  ShaderProgram program;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLuint local_14;
  GLuint notAProgram;
  GLuint shader;
  NegativeTestContext *ctx_local;
  
  _notAProgram = ctx;
  local_14 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  local_18 = glu::CallLogWrapper::glCreateProgram(&_notAProgram->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&_notAProgram->super_CallLogWrapper,local_18);
  pNVar2 = _notAProgram;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_39);
  NegativeTestContext::beginSection(pNVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glLinkProgram(&_notAProgram->super_CallLogWrapper,local_18);
  NegativeTestContext::expectError(_notAProgram,0x501);
  NegativeTestContext::endSection(_notAProgram);
  pNVar2 = _notAProgram;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_71);
  NegativeTestContext::beginSection(pNVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glLinkProgram(&_notAProgram->super_CallLogWrapper,local_14);
  NegativeTestContext::expectError(_notAProgram,0x502);
  NegativeTestContext::endSection(_notAProgram);
  glu::CallLogWrapper::glDeleteShader(&_notAProgram->super_CallLogWrapper,local_14);
  pNVar2 = _notAProgram;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_OPERATION is generated if program is the currently active program object and transform feedback mode is active."
             ,(allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  NegativeTestContext::beginSection(pNVar2,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  renderCtx = NegativeTestContext::getRenderContext(_notAProgram);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,puVar1,&local_261);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,puVar1,(allocator<char> *)((long)&tfID + 3));
  glu::makeVtxFragSources(&local_240,&local_260,(string *)&buf);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_170,renderCtx,&local_240);
  glu::ProgramSources::~ProgramSources(&local_240);
  std::__cxx11::string::~string((string *)&buf);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tfID + 3));
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  local_290 = 0x1234;
  tfVarying._4_4_ = 0x1234;
  local_2a0 = "gl_Position";
  glu::CallLogWrapper::glGenTransformFeedbacks
            (&_notAProgram->super_CallLogWrapper,1,(GLuint *)((long)&tfVarying + 4));
  glu::CallLogWrapper::glGenBuffers(&_notAProgram->super_CallLogWrapper,1,&local_290);
  pNVar2 = _notAProgram;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_170);
  glu::CallLogWrapper::glUseProgram(&pNVar2->super_CallLogWrapper,dVar3);
  pNVar2 = _notAProgram;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_170);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&pNVar2->super_CallLogWrapper,dVar3,1,&local_2a0,0x8c8c);
  pNVar2 = _notAProgram;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_170);
  glu::CallLogWrapper::glLinkProgram(&pNVar2->super_CallLogWrapper,dVar3);
  glu::CallLogWrapper::glBindTransformFeedback
            (&_notAProgram->super_CallLogWrapper,0x8e22,tfVarying._4_4_);
  glu::CallLogWrapper::glBindBuffer(&_notAProgram->super_CallLogWrapper,0x8c8e,local_290);
  glu::CallLogWrapper::glBufferData
            (&_notAProgram->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBufferBase(&_notAProgram->super_CallLogWrapper,0x8c8e,0,local_290);
  glu::CallLogWrapper::glBeginTransformFeedback(&_notAProgram->super_CallLogWrapper,4);
  NegativeTestContext::expectError(_notAProgram,0);
  pNVar2 = _notAProgram;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_170);
  glu::CallLogWrapper::glLinkProgram(&pNVar2->super_CallLogWrapper,dVar3);
  NegativeTestContext::expectError(_notAProgram,0x502);
  glu::CallLogWrapper::glEndTransformFeedback(&_notAProgram->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&_notAProgram->super_CallLogWrapper,1,(GLuint *)((long)&tfVarying + 4));
  glu::CallLogWrapper::glDeleteBuffers(&_notAProgram->super_CallLogWrapper,1,&local_290);
  NegativeTestContext::expectError(_notAProgram,0);
  NegativeTestContext::endSection(_notAProgram);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_170);
  return;
}

Assistant:

void link_program (NegativeTestContext& ctx)
{
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glLinkProgram(notAProgram);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glLinkProgram(shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the currently active program object and transform feedback mode is active.");
	glu::ShaderProgram			program(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	deUint32					buf = 0x1234;
	deUint32					tfID = 0x1234;
	const char* tfVarying		= "gl_Position";

	ctx.glGenTransformFeedbacks		(1, &tfID);
	ctx.glGenBuffers				(1, &buf);

	ctx.glUseProgram				(program.getProgram());
	ctx.glTransformFeedbackVaryings	(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.glLinkProgram				(program.getProgram());
	ctx.glBindTransformFeedback		(GL_TRANSFORM_FEEDBACK, tfID);
	ctx.glBindBuffer				(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
	ctx.glBufferData				(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
	ctx.glBindBufferBase			(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.expectError					(GL_NO_ERROR);

	ctx.glLinkProgram				(program.getProgram());
	ctx.expectError				(GL_INVALID_OPERATION);

	ctx.glEndTransformFeedback		();
	ctx.glDeleteTransformFeedbacks	(1, &tfID);
	ctx.glDeleteBuffers				(1, &buf);
	ctx.expectError				(GL_NO_ERROR);
	ctx.endSection();
}